

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

bool __thiscall CS248::Shader::prepareSourceCode(Shader *this,string *filename,string *out_source)

{
  char cVar1;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string version;
  byte abStack_218 [488];
  
  std::__cxx11::string::assign((char *)out_source);
  std::ifstream::ifstream(&version);
  std::ifstream::open((char *)&version,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::ifstream::~ifstream(&version);
  }
  else {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while ((abStack_218[*(long *)(version._M_dataplus._M_p + -0x18)] & 2) == 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&version,(string *)&line);
      std::operator+(&local_258,&line,"\n");
      std::__cxx11::string::append((string *)out_source);
      std::__cxx11::string::~string((string *)&local_258);
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&version);
    std::__cxx11::string::string((string *)&version,"#version 130\n",(allocator *)&line);
    std::operator+(&line,&version,out_source);
    std::__cxx11::string::operator=((string *)out_source,(string *)&line);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&version);
  }
  return (bool)cVar1;
}

Assistant:

bool Shader::prepareSourceCode(const std::string& filename, std::string* out_source) {
  if (!readFile(filename, *out_source)) {
    return false;
  }
#ifdef __APPLE__
  std::string version = "#version 150\n";
#else
  std::string version = "#version 130\n";
#endif 
  *out_source  = version + (*out_source);
  return true;
}